

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

int units::precise::custom::eq_type(unit_data *UT)

{
  unit_data uVar1;
  
  uVar1 = *UT;
  return ((uint)uVar1 >> 0x1e & 1 | (uint)uVar1 >> 0x1c & 2 | (uint)uVar1 >> 0x1a & 4) +
         (uint)(((uint)uVar1 & 0xc000000) != 0) * 8 | (uint)(((uint)uVar1 & 0xe00000) != 0) << 4;
}

Assistant:

constexpr int radian() const { return radians_; }